

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConverterRegistry.cpp
# Opt level: O1

ConverterFunction
SoapySDR::ConverterRegistry::getFunction
          (string *sourceFormat,string *targetFormat,FunctionPriority *priority)

{
  const_iterator cVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  *this;
  const_iterator cVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  mapped_type *pp_Var6;
  runtime_error *prVar7;
  long *plVar8;
  size_type *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lateLoadDefaultConverters();
  cVar1 = std::_Rb_tree<$22e880f7$>::find(&formatConverters_abi_cxx11_._M_t,sourceFormat);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &formatConverters_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,
                   "ConverterRegistry::getFunction() conversion source not registered; sourceFormat="
                   ,sourceFormat);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_c8._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar9) {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8.field_2._8_8_ = plVar8[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar9;
    }
    local_c8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::operator+(&local_68,&local_c8,targetFormat);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_e8._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar9) {
      local_e8.field_2._M_allocated_capacity = *psVar9;
      local_e8.field_2._8_8_ = plVar8[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar9;
    }
    local_e8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::to_string(&local_a8,*priority);
    std::operator+(&local_48,&local_e8,&local_a8);
    std::runtime_error::runtime_error(prVar7,(string *)&local_48);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = &std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat)->_M_t;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
          ::find(this,targetFormat);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->_M_impl).super__Rb_tree_header) {
    pmVar3 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
             ::operator[](pmVar3,targetFormat);
    sVar5 = std::
            map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
            ::count(pmVar4,priority);
    if (sVar5 != 0) {
      pmVar3 = std::map<$5159af05$>::operator[](&formatConverters_abi_cxx11_,sourceFormat);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
               ::operator[](pmVar3,targetFormat);
      pp_Var6 = std::
                map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                ::operator[](pmVar4,priority);
      return (ConverterFunction)*pp_Var6;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,
                   "ConverterRegistry::getFunction() conversion priority not registered; sourceFormat="
                   ,sourceFormat);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_c8._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar9) {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8.field_2._8_8_ = plVar8[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar9;
    }
    local_c8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::operator+(&local_68,&local_c8,targetFormat);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_e8._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar9) {
      local_e8.field_2._M_allocated_capacity = *psVar9;
      local_e8.field_2._8_8_ = plVar8[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar9;
    }
    local_e8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::to_string(&local_a8,*priority);
    std::operator+(&local_48,&local_e8,&local_a8);
    std::runtime_error::runtime_error(prVar7,(string *)&local_48);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,
                 "ConverterRegistry::getFunction() conversion target not registered; sourceFormat=",
                 sourceFormat);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_c8._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar9) {
    local_c8.field_2._M_allocated_capacity = *psVar9;
    local_c8.field_2._8_8_ = plVar8[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar9;
  }
  local_c8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::operator+(&local_68,&local_c8,targetFormat);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar9) {
    local_e8.field_2._M_allocated_capacity = *psVar9;
    local_e8.field_2._8_8_ = plVar8[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar9;
  }
  local_e8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::to_string(&local_a8,*priority);
  std::operator+(&local_48,&local_e8,&local_a8);
  std::runtime_error::runtime_error(prVar7,(string *)&local_48);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SoapySDR::ConverterRegistry::ConverterFunction SoapySDR::ConverterRegistry::getFunction(const std::string &sourceFormat, const std::string &targetFormat, const FunctionPriority &priority)
{
  lateLoadDefaultConverters();

  if (formatConverters.count(sourceFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion source not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat].count(targetFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion target not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat][targetFormat].count(priority) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion priority not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  return formatConverters[sourceFormat][targetFormat][priority];
}